

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cpp
# Opt level: O1

void __thiscall
jsonnet::internal::anon_unknown_0::Lexer_TestBlockStringNoWs_Test::~Lexer_TestBlockStringNoWs_Test
          (Lexer_TestBlockStringNoWs_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Lexer, TestBlockStringNoWs)
{
    const char str[] =
        "|||\n"
        "test\n"
        "|||";
    testLex("block string no ws",
            str,
            {},
            "block string no ws:1:1: text block's first line must start with"
            " whitespace.");
}